

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareWinSweepLeafTfo(Odc_Man_t *p)

{
  Abc_Obj_t *pObj;
  int i;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (i = 0; i < p->vLeaves->nSize; i = i + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,i);
    Abc_NtkDontCareWinSweepLeafTfo_rec
              (pObj,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nLevels,p->pNode);
  }
  return;
}

Assistant:

void Abc_NtkDontCareWinSweepLeafTfo( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NtkDontCareWinSweepLeafTfo_rec( pObj, p->pNode->Level + p->nLevels, p->pNode );
}